

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

ssize_t __thiscall
Json::StyledStreamWriter::write(StyledStreamWriter *this,int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  undefined4 in_register_00000034;
  
  this->document_ = (ostream *)CONCAT44(in_register_00000034,__fd);
  this->addChildValues_ = false;
  std::__cxx11::string::_M_replace
            ((ulong)&this->indentString_,0,(char *)(this->indentString_)._M_string_length,0x674b0e);
  writeCommentBeforeValue(this,(Value *)__buf);
  writeValue(this,(Value *)__buf);
  writeCommentAfterValueOnSameLine(this,(Value *)__buf);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->document_,"\n",1);
  this->document_ = (ostream *)0x0;
  return (ssize_t)poVar1;
}

Assistant:

void StyledStreamWriter::write(std::ostream& out, const Value& root) {
  document_ = &out;
  addChildValues_ = false;
  indentString_ = "";
  writeCommentBeforeValue(root);
  writeValue(root);
  writeCommentAfterValueOnSameLine(root);
  *document_ << "\n";
  document_ = NULL; // Forget the stream, for safety.
}